

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cio.c
# Opt level: O3

OPJ_OFF_T opj_stream_read_skip
                    (opj_stream_private_t *p_stream,OPJ_OFF_T p_size,opj_event_mgr_t *p_event_mgr)

{
  bool bVar1;
  OPJ_OFF_T OVar2;
  OPJ_OFF_T OVar3;
  long lVar4;
  ulong uVar5;
  
  uVar5 = (ulong)p_stream->m_bytes_in_buffer;
  if (p_size <= (long)uVar5) {
    p_stream->m_current_data = p_stream->m_current_data + p_size;
    p_stream->m_bytes_in_buffer = p_stream->m_bytes_in_buffer - (int)p_size;
    p_stream->m_byte_offset = p_stream->m_byte_offset + p_size;
    return p_size;
  }
  if ((p_stream->m_status & 4) != 0) {
    p_stream->m_current_data = p_stream->m_current_data + uVar5;
    p_stream->m_bytes_in_buffer = 0;
    p_stream->m_byte_offset = p_stream->m_byte_offset + uVar5;
LAB_001ecdb5:
    return -(ulong)(uVar5 == 0) | uVar5;
  }
  OVar3 = p_size;
  if (uVar5 != 0) {
    p_stream->m_current_data = p_stream->m_stored_data;
    p_stream->m_bytes_in_buffer = 0;
    OVar3 = p_size - uVar5;
    if (p_size - uVar5 == 0 || p_size < (long)uVar5) goto LAB_001ecd66;
  }
  do {
    OVar2 = (*p_stream->m_skip_fn)(OVar3,p_stream->m_user_data);
    if (OVar2 == -1) {
      opj_event_msg_v2(p_event_mgr,4,"Stream reached its end !\n");
      *(byte *)&p_stream->m_status = (byte)p_stream->m_status | 4;
      p_stream->m_byte_offset = p_stream->m_byte_offset + uVar5;
      goto LAB_001ecdb5;
    }
    uVar5 = uVar5 + OVar2;
    lVar4 = OVar3 - OVar2;
    bVar1 = OVar2 <= OVar3;
    OVar3 = lVar4;
  } while (lVar4 != 0 && bVar1);
LAB_001ecd66:
  p_stream->m_byte_offset = p_stream->m_byte_offset + uVar5;
  return uVar5;
}

Assistant:

OPJ_OFF_T opj_stream_read_skip (opj_stream_private_t * p_stream, OPJ_OFF_T p_size, opj_event_mgr_t * p_event_mgr)
{
	OPJ_OFF_T l_skip_nb_bytes = 0;
	OPJ_OFF_T l_current_skip_nb_bytes = 0;

	if
		(p_stream->m_bytes_in_buffer >= p_size)
	{
		p_stream->m_current_data += p_size;
		// it is safe to cast p_size to OPJ_SIZE_T since it is <= m_bytes_in_buffer
		// which is of type OPJ_SIZE_T
		p_stream->m_bytes_in_buffer -= (OPJ_SIZE_T)p_size;
		l_skip_nb_bytes += p_size;
		p_stream->m_byte_offset += l_skip_nb_bytes;
		return l_skip_nb_bytes;
	}

	// we are now in the case when the remaining data if not sufficient
	if
		(p_stream->m_status & opj_stream_e_end)
	{
		l_skip_nb_bytes += p_stream->m_bytes_in_buffer;
		p_stream->m_current_data += p_stream->m_bytes_in_buffer;
		p_stream->m_bytes_in_buffer = 0;
		p_stream->m_byte_offset += l_skip_nb_bytes;
		return l_skip_nb_bytes ? l_skip_nb_bytes : (OPJ_OFF_T) -1;
	}

	// the flag is not set, we copy data and then do an actual skip on the stream
	if
		(p_stream->m_bytes_in_buffer)
	{
		l_skip_nb_bytes += p_stream->m_bytes_in_buffer;
		p_stream->m_current_data = p_stream->m_stored_data;
		p_size -= p_stream->m_bytes_in_buffer;
		p_stream->m_bytes_in_buffer = 0;
	}

	while
		(p_size > 0)
	{
		// we should do an actual skip on the media
		l_current_skip_nb_bytes = p_stream->m_skip_fn(p_size, p_stream->m_user_data);
		if
			(l_current_skip_nb_bytes == (OPJ_OFF_T) -1)
		{
			opj_event_msg_v2(p_event_mgr, EVT_INFO, "Stream reached its end !\n");

			p_stream->m_status |= opj_stream_e_end;
			p_stream->m_byte_offset += l_skip_nb_bytes;
			// end if stream
			return l_skip_nb_bytes ? l_skip_nb_bytes : (OPJ_OFF_T) -1;
		}
		p_size -= l_current_skip_nb_bytes;
		l_skip_nb_bytes += l_current_skip_nb_bytes;
	}
	p_stream->m_byte_offset += l_skip_nb_bytes;
	return l_skip_nb_bytes;
}